

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::GiveInventory(AActor *this,PClassInventory *type,int amount,bool givecheat)

{
  bool bVar1;
  int iVar2;
  bool local_69;
  AWeapon *local_68;
  DVector3 local_58;
  AInventory *local_40;
  AInventory *item;
  AWeapon *pAStack_30;
  bool hadweap;
  AWeapon *savedPendingWeap;
  bool result;
  bool givecheat_local;
  PClassInventory *pPStack_20;
  int amount_local;
  PClassInventory *type_local;
  AActor *this_local;
  
  savedPendingWeap._2_1_ = 1;
  if (this->player == (player_t *)0x0) {
    local_68 = (AWeapon *)0x0;
  }
  else {
    local_68 = this->player->PendingWeapon;
  }
  pAStack_30 = local_68;
  if (this->player == (player_t *)0x0) {
    local_69 = true;
  }
  else {
    local_69 = this->player->ReadyWeapon != (AWeapon *)0x0;
  }
  item._7_1_ = local_69;
  savedPendingWeap._3_1_ = givecheat;
  savedPendingWeap._4_4_ = amount;
  pPStack_20 = type;
  type_local = (PClassInventory *)this;
  if (givecheat) {
    Pos(&local_58,this);
    local_40 = (AInventory *)Spawn(&type->super_PClassActor,&local_58,NO_REPLACE);
    if (local_40 == (AInventory *)0x0) {
      return false;
    }
  }
  else {
    local_40 = (AInventory *)Spawn(&type->super_PClassActor);
  }
  ClearCounters(&local_40->super_AActor);
  if (((savedPendingWeap._3_1_ & 1) == 0) || (0 < savedPendingWeap._4_4_)) {
    bVar1 = PClass::IsDescendantOf((PClass *)pPStack_20,ABasicArmorPickup::RegistrationInfo.MyClass)
    ;
    if (bVar1) {
      *(int *)&local_40[1].super_AActor.super_DThinker.super_DObject.ObjNext =
           savedPendingWeap._4_4_ *
           *(int *)&local_40[1].super_AActor.super_DThinker.super_DObject.ObjNext;
    }
    else {
      bVar1 = PClass::IsDescendantOf
                        ((PClass *)pPStack_20,ABasicArmorBonus::RegistrationInfo.MyClass);
      if (bVar1) {
        *(int *)((long)&local_40[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
             savedPendingWeap._4_4_ *
             *(int *)((long)&local_40[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
      }
      else if ((savedPendingWeap._3_1_ & 1) == 0) {
        local_40->Amount = savedPendingWeap._4_4_;
      }
      else {
        iVar2 = MIN<int>(savedPendingWeap._4_4_,local_40->MaxAmount);
        local_40->Amount = iVar2;
      }
    }
  }
  bVar1 = AInventory::CallTryPickup(local_40,this,(AActor **)0x0);
  if (!bVar1) {
    (*(local_40->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
    savedPendingWeap._2_1_ = 0;
  }
  if (((((savedPendingWeap._3_1_ & 1) == 0) && (this->player != (player_t *)0x0)) &&
      (pAStack_30 != (AWeapon *)0x0)) && ((item._7_1_ & 1) != 0)) {
    this->player->PendingWeapon = pAStack_30;
  }
  return (bool)(savedPendingWeap._2_1_ & 1);
}

Assistant:

bool AActor::GiveInventory(PClassInventory *type, int amount, bool givecheat)
{
	bool result = true;

	AWeapon *savedPendingWeap = player != NULL ? player->PendingWeapon : NULL;
	bool hadweap = player != NULL ? player->ReadyWeapon != NULL : true;

	AInventory *item;
	if (!givecheat)
	{
		item = static_cast<AInventory *>(Spawn (type));
	}
	else
	{
		item = static_cast<AInventory *>(Spawn (type, Pos(), NO_REPLACE));
		if (item == NULL) return false;
	}

	// This shouldn't count for the item statistics!
	item->ClearCounters();
	if (!givecheat || amount > 0)
	{
		if (type->IsDescendantOf (RUNTIME_CLASS(ABasicArmorPickup)))
		{
			static_cast<ABasicArmorPickup*>(item)->SaveAmount *= amount;
		}
		else if (type->IsDescendantOf (RUNTIME_CLASS(ABasicArmorBonus)))
		{
			static_cast<ABasicArmorBonus*>(item)->SaveAmount *= amount;
		}
		else
		{
			if (!givecheat)
				item->Amount = amount;
			else
				item->Amount = MIN (amount, item->MaxAmount);
		}
	}
	if (!item->CallTryPickup (this))
	{
		item->Destroy ();
		result = false;
	}
	// If the item was a weapon, don't bring it up automatically
	// unless the player was not already using a weapon.
	// Don't bring it up automatically if this is called by the give cheat.
	if (!givecheat && player != NULL && savedPendingWeap != NULL && hadweap)
	{
		player->PendingWeapon = savedPendingWeap;
	}
	return result;
}